

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O2

QDebug print(QDebug debug,SslError error)

{
  Stream *pSVar1;
  SslError in_EDX;
  undefined4 in_register_00000034;
  QDebug *this;
  long in_FS_OFFSET;
  QSslError QStack_48;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  this = (QDebug *)CONCAT44(in_register_00000034,error);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QSslError::QSslError(&QStack_48,in_EDX);
  QSslError::errorString((QString *)&local_40,&QStack_48);
  QDebug::operator<<(this,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QSslError::~QSslError(&QStack_48);
  pSVar1 = this->stream;
  this->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug print(QDebug debug, QSslError::SslError error)
{
    debug << QSslError(error).errorString();
    return debug;
}